

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.hpp
# Opt level: O0

set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> * __thiscall
burst::make_set<unsigned_long,boost::integer_range<int>>
          (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,burst *this,integer_range<int> *values)

{
  integer_iterator<int> __first;
  integer_iterator<int> __last;
  integer_range<int> *values_local;
  
  __first = std::begin<boost::integer_range<int>>((integer_range<int> *)this);
  __last = std::end<boost::integer_range<int>>((integer_range<int> *)this);
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<boost::range_detail::integer_iterator<int>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
             __return_storage_ptr__,__first,__last);
  return __return_storage_ptr__;
}

Assistant:

auto make_set (InputRange && values)
    {
        using std::begin;
        using std::end;
        return
            std::set<Value>
            (
                begin(std::forward<InputRange>(values)),
                end(std::forward<InputRange>(values))
            );
    }